

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dot.h
# Opt level: O0

PlainObject __thiscall
Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
          (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this)

{
  MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *this_00;
  EigenBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *in_RSI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar1;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar2;
  float fVar3;
  PlainObject PVar4;
  float local_94;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  local_90;
  RealScalar local_74;
  MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pMStack_70;
  RealScalar z;
  _Nested n;
  MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_local;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  RealScalar *local_40;
  ulong local_38;
  undefined8 uStack_30;
  undefined1 local_28 [16];
  RealScalar local_c;
  
  this_local = this;
  pMStack_70 = (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               EigenBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::derived(in_RSI);
  local_74 = squaredNorm(pMStack_70);
  this_00 = (MatrixBase<Eigen::Matrix<float,3,1,0,3,1>> *)pMStack_70;
  fVar3 = 0.0;
  if (local_74 <= 0.0) {
    Matrix<float,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<float,_3,_1,_0,_3,_1> *)this,(Matrix<float,_3,_1,_0,_3,_1> *)pMStack_70);
    uVar1 = extraout_XMM0_Da_00;
    uVar2 = extraout_XMM0_Db_00;
  }
  else {
    local_40 = &local_74;
    local_28._4_4_ = 0;
    local_28._0_4_ = local_74;
    local_38 = local_28._0_8_;
    uStack_30 = 0;
    local_58 = SQRT(local_74);
    fStack_54 = 0.0;
    fStack_50 = 0.0;
    fStack_4c = 0.0;
    local_28 = ZEXT416((uint)local_74);
    local_c = local_74;
    local_94 = internal::pfirst<float__vector(4)>((Packet4f *)&local_58);
    MatrixBase<Eigen::Matrix<float,3,1,0,3,1>>::operator/(&local_90,this_00,&local_94);
    Matrix<float,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const>>
              ((Matrix<float,3,1,0,3,1> *)this,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                *)&local_90);
    uVar1 = extraout_XMM0_Da;
    uVar2 = extraout_XMM0_Db;
  }
  PVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (float)uVar2;
  PVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (float)uVar1;
  PVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       fVar3;
  return (PlainObject)
         PVar4.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

typename MatrixBase<Derived>::PlainObject
MatrixBase<Derived>::normalized() const
{
  typedef typename internal::nested_eval<Derived,2>::type _Nested;
  _Nested n(derived());
  RealScalar z = n.squaredNorm();
  // NOTE: after extensive benchmarking, this conditional does not impact performance, at least on recent x86 CPU
  if(z>RealScalar(0))
    return n / numext::sqrt(z);
  else
    return n;
}